

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

void __thiscall UnifiedRegex::RegexPattern::Print(RegexPattern *this,DebugWriter *w)

{
  Char c;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  char16_t *form;
  uint uVar5;
  uint uVar6;
  undefined1 local_40 [8];
  InternalString str;
  
  DebugWriter::Print(w,L"/");
  Js::InternalString::InternalString
            ((InternalString *)local_40,(char16 *)**(undefined8 **)&this->rep,
             *(charcount_t *)(*(undefined8 **)&this->rep + 1),'\0');
  uVar6 = local_40._0_4_;
  if (local_40._0_4_ == 0) {
    DebugWriter::Print(w,L"(?:)");
  }
  else if (local_40._0_4_ != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar4 = 0;
    do {
      uVar5 = (uint)uVar4;
      c = *(Char *)((ulong)local_40[4] * 2 + str._0_8_ + uVar4 * 2);
      if ((ushort)c < 0x2f) {
        if (((c == L'\n') || (c == L'\r')) || (c != L'-')) {
LAB_00ef2c85:
          DebugWriter::PrintEscapedChar(w,c);
        }
        else {
          DebugWriter::Print(w,L"-");
        }
      }
      else {
        if ((ushort)c - 0x2028 < 2) goto LAB_00ef2c85;
        if (c == L'\\') {
          uVar5 = uVar5 + 1;
          if (uVar6 <= uVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                               ,0xbe,"(i + 1 < str.GetLength())","i + 1 < str.GetLength()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar3 = 0;
          }
          uVar4 = (ulong)*(ushort *)((ulong)local_40[4] * 2 + str._0_8_ + (ulong)uVar5 * 2);
        }
        else {
          if (c != L'/') goto LAB_00ef2c85;
          uVar4 = 0x2f;
        }
        DebugWriter::Print(w,L"\\%lc",uVar4);
      }
      uVar4 = (ulong)(uVar5 + 1);
      uVar6 = local_40._0_4_;
    } while (uVar5 + 1 < (uint)local_40._0_4_);
  }
  DebugWriter::Print(w,L"/");
  if ((((this->rep).unified.program.ptr)->flags & IgnoreCaseRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"i");
  }
  if ((((this->rep).unified.program.ptr)->flags & GlobalRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"g");
  }
  if ((((this->rep).unified.program.ptr)->flags & MultilineRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"m");
  }
  if ((((((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
       threadConfig)->m_ES2018RegExDotAll == true) &&
     ((((this->rep).unified.program.ptr)->flags & DotAllRegexFlag) != NoRegexFlags)) {
    DebugWriter::Print(w,L"s");
  }
  if ((((((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
       threadConfig)->m_ES6Unicode == true) &&
     ((((this->rep).unified.program.ptr)->flags & UnicodeRegexFlag) != NoRegexFlags)) {
    DebugWriter::Print(w,L"u");
  }
  if ((((((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
       threadConfig)->m_ES6RegExSticky == true) &&
     ((((this->rep).unified.program.ptr)->flags & StickyRegexFlag) != NoRegexFlags)) {
    DebugWriter::Print(w,L"y");
  }
  DebugWriter::Print(w,L" /* ");
  DebugWriter::Print(w,L", ");
  form = L"dynamic";
  if ((this->field_0x18 & 1) != 0) {
    form = L"literal";
  }
  DebugWriter::Print(w,form);
  DebugWriter::Print(w,L" */");
  return;
}

Assistant:

void RegexPattern::Print(DebugWriter* w)
    {
        w->Print(_u("/"));

        Js::InternalString str = GetSource();
        if (str.GetLength() == 0)
            w->Print(_u("(?:)"));
        else
        {
            for (charcount_t i = 0; i < str.GetLength(); ++i)
            {
                const char16 c = str.GetBuffer()[i];
                switch(c)
                {
                case _u('/'):
                    w->Print(_u("\\%lc"), c);
                    break;
                case _u('\n'):
                case _u('\r'):
                case _u('\x2028'):
                case _u('\x2029'):
                    w->PrintEscapedChar(c);
                    break;
                case _u('-'):
                    w->Print(_u("-"));
                    break;
                case _u('\\'):
                    Assert(i + 1 < str.GetLength()); // cannot end in a '\'
                    w->Print(_u("\\%lc"), str.GetBuffer()[++i]);
                    break;
                default:
                    w->PrintEscapedChar(c);
                    break;
                }
            }
        }
        w->Print(_u("/"));
        if (IsIgnoreCase())
            w->Print(_u("i"));
        if (IsGlobal())
            w->Print(_u("g"));
        if (IsMultiline())
            w->Print(_u("m"));
        if (IsDotAll())
            w->Print(_u("s"));
        if (IsUnicode())
            w->Print(_u("u"));
        if (IsSticky())
            w->Print(_u("y"));
        w->Print(_u(" /* "));
        w->Print(_u(", "));
        w->Print(isLiteral ? _u("literal") : _u("dynamic"));
        w->Print(_u(" */"));
    }